

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ILBDOperator.cpp
# Opt level: O3

void __thiscall lts2::LBDOperator::LBDOperator(LBDOperator *this,int M)

{
  BasisFunction *pBVar1;
  
  (this->super_LinearOperator)._norm = 1.0;
  (this->super_LinearOperator)._vptr_LinearOperator = (_func_int **)&PTR__LBDOperator_0010a858;
  *(int *)&(this->super_LinearOperator).field_0xc = M;
  (this->_patchSize).width = 0x40;
  (this->_patchSize).height = 0x40;
  cv::Mat::Mat(&this->_integralImage);
  this->_basisFunctions = (BasisFunction *)0x0;
  this->_sensitiveCells = (IntegratingCell *)0x0;
  (this->super_LinearOperator)._norm = 10.0;
  pBVar1 = (BasisFunction *)
           operator_new__((ulong)*(uint *)&(this->super_LinearOperator).field_0xc << 3);
  this->_basisFunctions = pBVar1;
  return;
}

Assistant:

lts2::LBDOperator::LBDOperator(int M) : lts2::LinearOperator(), _pairsInUse(M), _patchSize(cv::Size(64,64)), _sensitiveCells(NULL), _basisFunctions(NULL)
{
  this->setNorm(10.0);
  _basisFunctions = new lbd::BasisFunction[_pairsInUse];
}